

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall fasttext::Dictionary::readFromFile(Dictionary *this,istream *in)

{
  element_type *peVar1;
  bool bVar2;
  long lVar3;
  Dictionary *this_00;
  ostream *poVar4;
  long *plVar5;
  invalid_argument *this_01;
  string word;
  long local_58;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_58 = 1;
  this_00 = this;
  while( true ) {
    bVar2 = readWord(this_00,in,&local_50);
    if (!bVar2) break;
    this_00 = this;
    add(this,&local_50);
    lVar3 = this->ntokens_ * 0x790fb65668c26139;
    if (((lVar3 + 0x218def416bd80U >> 6 | lVar3 << 0x3a) < 0x10c6f7a0b5ed) &&
       (1 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            verbose)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\rRead ",6);
      this_00 = (Dictionary *)std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"M words",7);
      std::ostream::flush();
    }
    if (22500000 < this->size_) {
      local_58 = local_58 + 1;
      this_00 = this;
      threshold(this,local_58,local_58);
    }
  }
  peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  threshold(this,(long)peVar1->minCount,(long)peVar1->minCountLabel);
  initTableDiscard(this);
  initNgrams(this);
  if (0 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\rRead ",6);
    poVar4 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"M words",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Number of words:  ",0x12);
    plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cerr,this->nwords_);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Number of labels: ",0x12);
    plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cerr,this->nlabels_);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
  }
  if (this->size_ != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    return;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_01,"Empty vocabulary. Try a smaller -minCount value.");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Dictionary::readFromFile(std::istream& in) {
  std::string word;
  int64_t minThreshold = 1;
  while (readWord(in, word)) {
    add(word);
    if (ntokens_ % 1000000 == 0 && args_->verbose > 1) {
      std::cerr << "\rRead " << ntokens_ / 1000000 << "M words" << std::flush;
    }
    if (size_ > 0.75 * MAX_VOCAB_SIZE) {
      minThreshold++;
      threshold(minThreshold, minThreshold);
    }
  }
  threshold(args_->minCount, args_->minCountLabel);
  initTableDiscard();
  initNgrams();
  if (args_->verbose > 0) {
    std::cerr << "\rRead " << ntokens_ / 1000000 << "M words" << std::endl;
    std::cerr << "Number of words:  " << nwords_ << std::endl;
    std::cerr << "Number of labels: " << nlabels_ << std::endl;
  }
  if (size_ == 0) {
    throw std::invalid_argument(
        "Empty vocabulary. Try a smaller -minCount value.");
  }
}